

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakSet.cpp
# Opt level: O0

Var Js::JavascriptWeakSet::EntryAdd(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptLibrary *this_00;
  RecyclableObject *this_01;
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_02;
  RecyclableObject *local_90;
  RecyclableObject *local_78;
  RecyclableObject *keyObj;
  Var key;
  JavascriptWeakSet *weakSet;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_18;
  TypeId typeId;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakSet.cpp"
                                ,0x50,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  weakSet = (JavascriptWeakSet *)RecyclableObject::GetScriptContext(function);
  pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::JavascriptWeakSet>(pvVar6);
  if (!bVar2) {
    JavascriptError::ThrowTypeErrorVar
              ((ScriptContext *)weakSet,-0x7ff5ec04,L"WeakSet.prototype.add",L"WeakSet");
  }
  pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
  key = VarTo<Js::JavascriptWeakSet>(pvVar6);
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    this_00 = ScriptContext::GetLibrary((ScriptContext *)weakSet);
    local_90 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  }
  else {
    local_90 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
  }
  keyObj = local_90;
  BVar3 = Js::JavascriptOperators::IsObject(local_90);
  if (BVar3 != 0) {
    callInfo_local = (CallInfo)keyObj;
    if (keyObj == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = TaggedInt::Is((Var)callInfo_local);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck((Var)callInfo_local);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        this_01 = UnsafeVarTo<Js::RecyclableObject>((Var)callInfo_local);
        if (this_01 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        local_18 = RecyclableObject::GetTypeId(this_01);
        if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this_01), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
    }
    if (local_18 != TypeIds_HostDispatch) {
      local_78 = VarTo<Js::RecyclableObject>(keyObj);
      bVar2 = ScriptContext::IsTTDReplayModeEnabled((ScriptContext *)weakSet);
      if (bVar2) {
        this_02 = Memory::
                  RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                  ::operator->((RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                                *)(*(long *)&weakSet[0x35].keySet.
                                             super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                                             .count + 0x120));
        JsUtil::
        BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::AddNew(this_02,&local_78);
      }
      Add((JavascriptWeakSet *)key,local_78);
      return key;
    }
  }
  JavascriptError::ThrowTypeError((ScriptContext *)weakSet,-0x7ff5ec03,L"WeakSet.prototype.add");
}

Assistant:

Var JavascriptWeakSet::EntryAdd(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (!VarIs<JavascriptWeakSet>(args[0]))
        {
            JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("WeakSet.prototype.add"), _u("WeakSet"));
        }

        JavascriptWeakSet* weakSet = VarTo<JavascriptWeakSet>(args[0]);

        Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();

        if (!JavascriptOperators::IsObject(key) || JavascriptOperators::GetTypeId(key) == TypeIds_HostDispatch)
        {
            // HostDispatch is not expanded so can't have internal property added to it.
            // TODO: Support HostDispatch as WeakSet key
            JavascriptError::ThrowTypeError(scriptContext, JSERR_WeakMapSetKeyNotAnObject, _u("WeakSet.prototype.add"));
        }

        RecyclableObject* keyObj = VarTo<RecyclableObject>(key);

#if ENABLE_TTD
        //In replay we need to pin the object (and will release at snapshot points) -- in record we don't need to do anything
        if(scriptContext->IsTTDReplayModeEnabled())
        {
            scriptContext->TTDContextInfo->TTDWeakReferencePinSet->AddNew(keyObj);
        }
#endif

        weakSet->Add(keyObj);

        return weakSet;
    }